

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinstatsindex.cpp
# Opt level: O1

bool LookUpOne(CDBWrapper *db,BlockRef *block,DBVal *result)

{
  Span<const_std::byte> sp;
  bool bVar1;
  long lVar2;
  DBVal *pDVar3;
  long in_FS_OFFSET;
  bool bVar4;
  byte bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  Span<const_std::byte> key;
  pair<uint256,_(anonymous_namespace)::DBVal>_conflict read_out;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  strValue;
  DataStream DStack_158;
  undefined1 local_138 [24];
  size_type sStack_120;
  DBHashKey local_118;
  pair<uint256,_(anonymous_namespace)::DBVal>_conflict local_f8;
  undefined1 local_58 [32];
  char local_38;
  long local_30;
  
  bVar5 = 0;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  bVar4 = false;
  memset(&local_f8,0,0xa0);
  local_58._0_4_ = block->height;
  bVar1 = CDBWrapper::
          Read<(anonymous_namespace)::DBHeightKey,std::pair<uint256,(anonymous_namespace)::DBVal>>
                    (db,(DBHeightKey *)
                        &((_Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                           *)local_58)->_M_value,&local_f8);
  if (bVar1) {
    auVar7[0] = -((block->hash).super_base_blob<256U>.m_data._M_elems[0] ==
                 local_f8.first.super_base_blob<256U>.m_data._M_elems[0]);
    auVar7[1] = -((block->hash).super_base_blob<256U>.m_data._M_elems[1] ==
                 local_f8.first.super_base_blob<256U>.m_data._M_elems[1]);
    auVar7[2] = -((block->hash).super_base_blob<256U>.m_data._M_elems[2] ==
                 local_f8.first.super_base_blob<256U>.m_data._M_elems[2]);
    auVar7[3] = -((block->hash).super_base_blob<256U>.m_data._M_elems[3] ==
                 local_f8.first.super_base_blob<256U>.m_data._M_elems[3]);
    auVar7[4] = -((block->hash).super_base_blob<256U>.m_data._M_elems[4] ==
                 local_f8.first.super_base_blob<256U>.m_data._M_elems[4]);
    auVar7[5] = -((block->hash).super_base_blob<256U>.m_data._M_elems[5] ==
                 local_f8.first.super_base_blob<256U>.m_data._M_elems[5]);
    auVar7[6] = -((block->hash).super_base_blob<256U>.m_data._M_elems[6] ==
                 local_f8.first.super_base_blob<256U>.m_data._M_elems[6]);
    auVar7[7] = -((block->hash).super_base_blob<256U>.m_data._M_elems[7] ==
                 local_f8.first.super_base_blob<256U>.m_data._M_elems[7]);
    auVar7[8] = -((block->hash).super_base_blob<256U>.m_data._M_elems[8] ==
                 local_f8.first.super_base_blob<256U>.m_data._M_elems[8]);
    auVar7[9] = -((block->hash).super_base_blob<256U>.m_data._M_elems[9] ==
                 local_f8.first.super_base_blob<256U>.m_data._M_elems[9]);
    auVar7[10] = -((block->hash).super_base_blob<256U>.m_data._M_elems[10] ==
                  local_f8.first.super_base_blob<256U>.m_data._M_elems[10]);
    auVar7[0xb] = -((block->hash).super_base_blob<256U>.m_data._M_elems[0xb] ==
                   local_f8.first.super_base_blob<256U>.m_data._M_elems[0xb]);
    auVar7[0xc] = -((block->hash).super_base_blob<256U>.m_data._M_elems[0xc] ==
                   local_f8.first.super_base_blob<256U>.m_data._M_elems[0xc]);
    auVar7[0xd] = -((block->hash).super_base_blob<256U>.m_data._M_elems[0xd] ==
                   local_f8.first.super_base_blob<256U>.m_data._M_elems[0xd]);
    auVar7[0xe] = -((block->hash).super_base_blob<256U>.m_data._M_elems[0xe] ==
                   local_f8.first.super_base_blob<256U>.m_data._M_elems[0xe]);
    auVar7[0xf] = -((block->hash).super_base_blob<256U>.m_data._M_elems[0xf] ==
                   local_f8.first.super_base_blob<256U>.m_data._M_elems[0xf]);
    auVar6[0] = -((block->hash).super_base_blob<256U>.m_data._M_elems[0x10] ==
                 local_f8.first.super_base_blob<256U>.m_data._M_elems[0x10]);
    auVar6[1] = -((block->hash).super_base_blob<256U>.m_data._M_elems[0x11] ==
                 local_f8.first.super_base_blob<256U>.m_data._M_elems[0x11]);
    auVar6[2] = -((block->hash).super_base_blob<256U>.m_data._M_elems[0x12] ==
                 local_f8.first.super_base_blob<256U>.m_data._M_elems[0x12]);
    auVar6[3] = -((block->hash).super_base_blob<256U>.m_data._M_elems[0x13] ==
                 local_f8.first.super_base_blob<256U>.m_data._M_elems[0x13]);
    auVar6[4] = -((block->hash).super_base_blob<256U>.m_data._M_elems[0x14] ==
                 local_f8.first.super_base_blob<256U>.m_data._M_elems[0x14]);
    auVar6[5] = -((block->hash).super_base_blob<256U>.m_data._M_elems[0x15] ==
                 local_f8.first.super_base_blob<256U>.m_data._M_elems[0x15]);
    auVar6[6] = -((block->hash).super_base_blob<256U>.m_data._M_elems[0x16] ==
                 local_f8.first.super_base_blob<256U>.m_data._M_elems[0x16]);
    auVar6[7] = -((block->hash).super_base_blob<256U>.m_data._M_elems[0x17] ==
                 local_f8.first.super_base_blob<256U>.m_data._M_elems[0x17]);
    auVar6[8] = -((block->hash).super_base_blob<256U>.m_data._M_elems[0x18] ==
                 local_f8.first.super_base_blob<256U>.m_data._M_elems[0x18]);
    auVar6[9] = -((block->hash).super_base_blob<256U>.m_data._M_elems[0x19] ==
                 local_f8.first.super_base_blob<256U>.m_data._M_elems[0x19]);
    auVar6[10] = -((block->hash).super_base_blob<256U>.m_data._M_elems[0x1a] ==
                  local_f8.first.super_base_blob<256U>.m_data._M_elems[0x1a]);
    auVar6[0xb] = -((block->hash).super_base_blob<256U>.m_data._M_elems[0x1b] ==
                   local_f8.first.super_base_blob<256U>.m_data._M_elems[0x1b]);
    auVar6[0xc] = -((block->hash).super_base_blob<256U>.m_data._M_elems[0x1c] ==
                   local_f8.first.super_base_blob<256U>.m_data._M_elems[0x1c]);
    auVar6[0xd] = -((block->hash).super_base_blob<256U>.m_data._M_elems[0x1d] ==
                   local_f8.first.super_base_blob<256U>.m_data._M_elems[0x1d]);
    auVar6[0xe] = -((block->hash).super_base_blob<256U>.m_data._M_elems[0x1e] ==
                   local_f8.first.super_base_blob<256U>.m_data._M_elems[0x1e]);
    auVar6[0xf] = -((block->hash).super_base_blob<256U>.m_data._M_elems[0x1f] ==
                   local_f8.first.super_base_blob<256U>.m_data._M_elems[0x1f]);
    auVar6 = auVar6 & auVar7;
    if ((ushort)((ushort)(SUB161(auVar6 >> 7,0) & 1) | (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar6 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar6 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar6 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar6 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar6 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar6 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar6 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar6 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar6 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar6 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar6 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar6 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar6 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar6[0xf] >> 7) << 0xf) == 0xffff) {
      pDVar3 = &local_f8.second;
      for (lVar2 = 0x10; lVar2 != 0; lVar2 = lVar2 + -1) {
        *(undefined8 *)(result->muhash).super_base_blob<256U>.m_data._M_elems =
             *(undefined8 *)(pDVar3->muhash).super_base_blob<256U>.m_data._M_elems;
        pDVar3 = (DBVal *)((long)pDVar3 + ((ulong)bVar5 * -2 + 1) * 8);
        result = (DBVal *)((long)result + (ulong)bVar5 * -0x10 + 8);
      }
      bVar4 = true;
    }
    else {
      local_118.block_hash.super_base_blob<256U>.m_data._M_elems._0_8_ =
           *(undefined8 *)(block->hash).super_base_blob<256U>.m_data._M_elems;
      local_118.block_hash.super_base_blob<256U>.m_data._M_elems._8_8_ =
           *(undefined8 *)((block->hash).super_base_blob<256U>.m_data._M_elems + 8);
      local_118.block_hash.super_base_blob<256U>.m_data._M_elems._16_8_ =
           *(undefined8 *)((block->hash).super_base_blob<256U>.m_data._M_elems + 0x10);
      local_118.block_hash.super_base_blob<256U>.m_data._M_elems._24_8_ =
           *(undefined8 *)((block->hash).super_base_blob<256U>.m_data._M_elems + 0x18);
      stack0xfffffffffffffed8 = (undefined1  [16])0x0;
      local_138._0_16_ = (undefined1  [16])0x0;
      std::vector<std::byte,_zero_after_free_allocator<std::byte>_>::reserve
                ((vector<std::byte,_zero_after_free_allocator<std::byte>_> *)local_138,0x40);
      DataStream::operator<<((DataStream *)local_138,&local_118);
      key.m_data = (byte *)(local_138._0_8_ + sStack_120);
      key.m_size = local_138._8_8_ - (long)key.m_data;
      CDBWrapper::ReadImpl_abi_cxx11_
                ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&((_Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                       *)local_58)->_M_value,db,key);
      bVar4 = local_38 != '\0';
      if (bVar4) {
        sp.m_data._4_4_ = local_58._4_4_;
        sp.m_data._0_4_ = local_58._0_4_;
        sp.m_size = local_58._8_8_;
        DataStream::DataStream(&DStack_158,sp);
        DataStream::Xor(&DStack_158,&db->obfuscate_key);
        Unserialize<DataStream,_(anonymous_namespace)::DBVal_&>(&DStack_158,result);
        std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
                  ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&DStack_158);
      }
      if (local_38 == '\x01') {
        local_38 = '\0';
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_58._4_4_,local_58._0_4_) !=
            &(((_Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                *)local_58)->_M_value).field_2) {
          operator_delete((undefined1 *)CONCAT44(local_58._4_4_,local_58._0_4_),local_58._16_8_ + 1)
          ;
        }
      }
      std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
                ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)local_138);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return bVar4;
}

Assistant:

static bool LookUpOne(const CDBWrapper& db, const interfaces::BlockRef& block, DBVal& result)
{
    // First check if the result is stored under the height index and the value
    // there matches the block hash. This should be the case if the block is on
    // the active chain.
    std::pair<uint256, DBVal> read_out;
    if (!db.Read(DBHeightKey(block.height), read_out)) {
        return false;
    }
    if (read_out.first == block.hash) {
        result = std::move(read_out.second);
        return true;
    }

    // If value at the height index corresponds to an different block, the
    // result will be stored in the hash index.
    return db.Read(DBHashKey(block.hash), result);
}